

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoViableAltForCharException.cpp
# Opt level: O1

void __thiscall
antlr::NoViableAltForCharException::NoViableAltForCharException
          (NoViableAltForCharException *this,int c,CharScanner *scanner)

{
  int iVar1;
  int line_;
  int column_;
  undefined4 extraout_var;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"NoViableAlt","");
  iVar1 = (*(scanner->super_TokenStream)._vptr_TokenStream[0x1a])(scanner);
  line_ = (*(scanner->super_TokenStream)._vptr_TokenStream[0x16])(scanner);
  column_ = (*(scanner->super_TokenStream)._vptr_TokenStream[0x18])(scanner);
  RecognitionException::RecognitionException
            (&this->super_RecognitionException,&local_50,(string *)CONCAT44(extraout_var,iVar1),
             line_,column_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (this->super_RecognitionException).super_ANTLRException._vptr_ANTLRException =
       (_func_int **)&PTR__RecognitionException_002bbc70;
  this->foundChar = c;
  return;
}

Assistant:

NoViableAltForCharException::NoViableAltForCharException(int c, CharScanner* scanner)
  : RecognitionException("NoViableAlt",
                         scanner->getFilename(),
								 scanner->getLine(),scanner->getColumn()),
    foundChar(c)
{
}